

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlCrc32.cpp
# Opt level: O1

filepos_t __thiscall
libebml::EbmlCrc32::RenderData(EbmlCrc32 *this,IOCallback *output,bool param_2,bool param_3)

{
  void *__s;
  ulong uVar1;
  filepos_t fVar2;
  
  fVar2 = 4;
  IOCallback::writeFully(output,&this->m_crc_final,4);
  uVar1 = (this->super_EbmlBinary).super_EbmlElement.DefaultSize;
  if (4 < uVar1) {
    uVar1 = uVar1 - 4;
    __s = operator_new__(uVar1,(nothrow_t *)&std::nothrow);
    if (__s != (void *)0x0) {
      memset(__s,0,uVar1);
      IOCallback::writeFully(output,__s,uVar1);
      fVar2 = (this->super_EbmlBinary).super_EbmlElement.DefaultSize;
      operator_delete__(__s);
    }
  }
  return fVar2;
}

Assistant:

filepos_t EbmlCrc32::RenderData(IOCallback & output, bool /* bForceRender */, bool /* bWithDefault */)
{
  filepos_t Result = 4;

  if (Result != 0) {
    output.writeFully(&m_crc_final, Result);
  }

  if (Result < GetDefaultSize()) {
    // pad the rest with 0
    binary *Pad = new (std::nothrow) binary[GetDefaultSize() - Result];
    if (Pad != NULL) {
      memset(Pad, 0x00, GetDefaultSize() - Result);
      output.writeFully(Pad, GetDefaultSize() - Result);

      Result = GetDefaultSize();
      delete [] Pad;
    }
  }

  return Result;
}